

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O1

bool __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundLiteral(FiniteModelMultiSorted *this,Literal *lit)

{
  char cVar1;
  uint uVar2;
  int *__s;
  OperatorType *pOVar3;
  TermList TVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ulong uVar12;
  uint uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  int iVar15;
  uint *res;
  bool bVar16;
  DArray<unsigned_int> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (ulong)*(uint *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x80) +
                                      (long)(int)(lit->super_Term)._functor * 8) + 0x20);
  pbVar17 = pbVar14;
  if (pbVar14 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    __s = (int *)0x0;
  }
  else {
    uVar12 = (long)pbVar14 * 4 + 0xfU & 0x7fffffff0;
    if (uVar12 == 0) {
      __s = (int *)::Lib::FixedSizeAllocator<8UL>::alloc
                             ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar12 < 0x11) {
      __s = (int *)::Lib::FixedSizeAllocator<16UL>::alloc
                             ((FixedSizeAllocator<16UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar12 < 0x19) {
      __s = (int *)::Lib::FixedSizeAllocator<24UL>::alloc
                             ((FixedSizeAllocator<24UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar12 < 0x21) {
      __s = (int *)::Lib::FixedSizeAllocator<32UL>::alloc
                             ((FixedSizeAllocator<32UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar12 < 0x31) {
      __s = (int *)::Lib::FixedSizeAllocator<48UL>::alloc
                             ((FixedSizeAllocator<48UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar12 < 0x41) {
      __s = (int *)::Lib::FixedSizeAllocator<64UL>::alloc
                             ((FixedSizeAllocator<64UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      __s = (int *)::operator_new(uVar12,0x10);
    }
    if (pbVar14 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      memset(__s,0,(long)pbVar14 << 2);
    }
  }
  if (pbVar14 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    iVar15 = 0;
    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      uVar2 = evaluateGroundTerm(this,(Term *)(lit->super_Term)._args
                                              [(int)((*(uint *)&(lit->super_Term).field_0xc &
                                                     0xfffffff) + iVar15)]._content);
      __s[(long)pbVar11] = uVar2;
      if (uVar2 == 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x50);
        Kernel::Literal::toString_abi_cxx11_(&local_70,lit);
        std::operator+(&local_50,"Could not evaluate ",&local_70);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_110._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_110._M_dataplus._M_p == psVar8) {
          local_110.field_2._M_allocated_capacity = *psVar8;
          local_110.field_2._8_8_ = plVar7[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar8;
        }
        local_110._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        Kernel::Term::toString_abi_cxx11_
                  (&local_90,
                   (Term *)(lit->super_Term)._args
                           [(int)((*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - (int)pbVar11
                                 )]._content,true);
        std::operator+(pbVar17,in_stack_fffffffffffffec8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_b0 = (long *)*plVar7;
        plVar9 = plVar7 + 2;
        if (local_b0 == plVar9) {
          local_a0 = *plVar9;
          uStack_98 = (undefined4)plVar7[3];
          uStack_94 = *(undefined4 *)((long)plVar7 + 0x1c);
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar9;
        }
        local_a8 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        *puVar6 = &PTR_cry_00b69f40;
        puVar6[1] = puVar6 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar6 + 1),local_b0,local_a8 + (long)local_b0);
        *puVar6 = &PTR_cry_00b6a028;
        *(undefined4 *)(puVar6 + 5) = 0;
        puVar6[6] = puVar6 + 8;
        puVar6[7] = 0;
        *(undefined1 *)(puVar6 + 8) = 0;
        __cxa_throw(puVar6,&::Lib::UserErrorException::typeinfo,
                    ::Lib::UserErrorException::~UserErrorException);
      }
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar11->_M_dataplus)._M_p + 1);
      iVar15 = iVar15 + -1;
    } while (pbVar14 != pbVar11);
  }
  uVar12 = (ulong)(lit->super_Term)._functor;
  if (uVar12 == 0) {
    bVar16 = *__s == __s[1];
  }
  else {
    pOVar3 = Kernel::Signature::Symbol::predType
                       (*(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x80) + uVar12 * 8));
    uVar2 = (this->_p_offsets)._array[(lit->super_Term)._functor];
    if (pbVar17 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      iVar15 = 1;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      do {
        iVar10 = __s[(long)pbVar11];
        uVar13 = (uint)pbVar11;
        if (uVar13 < pOVar3->_typeArgsArity) {
          TVar4 = Kernel::AtomicSort::superSort();
        }
        else {
          TVar4._content =
               *(uint64_t *)(pOVar3->_key + (ulong)(uVar13 - pOVar3->_typeArgsArity) * 8 + 8);
        }
        iVar10 = (iVar10 + -1) * iVar15;
        iVar15 = iVar15 * (this->_sizes)._array[*(uint *)(TVar4._content + 8)];
        uVar2 = uVar2 + iVar10;
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(uVar13 + 1);
      } while (pbVar11 < pbVar17);
    }
    cVar1 = (this->_p_interpretation)._array[uVar2];
    if (cVar1 == '\0') {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x50);
      Kernel::Literal::toString_abi_cxx11_(&local_110,lit);
      std::operator+(&local_d0,"Could not evaluate ",&local_110);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_f0 = (long *)*plVar7;
      plVar9 = plVar7 + 2;
      if (local_f0 == plVar9) {
        local_e0 = *plVar9;
        uStack_d8 = (undefined4)plVar7[3];
        uStack_d4 = *(undefined4 *)((long)plVar7 + 0x1c);
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar9;
      }
      local_e8 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      *puVar6 = &PTR_cry_00b69f40;
      puVar6[1] = puVar6 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar6 + 1),local_f0,local_e8 + (long)local_f0);
      *puVar6 = &PTR_cry_00b6a028;
      *(undefined4 *)(puVar6 + 5) = 0;
      puVar6[6] = puVar6 + 8;
      puVar6[7] = 0;
      *(undefined1 *)(puVar6 + 8) = 0;
      __cxa_throw(puVar6,&::Lib::UserErrorException::typeinfo,
                  ::Lib::UserErrorException::~UserErrorException);
    }
    bVar16 = cVar1 == '\x02';
  }
  uVar12 = (lit->super_Term)._args[0]._content;
  if (__s != (int *)0x0) {
    uVar5 = (long)pbVar14 * 4 + 0xfU & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *(undefined8 *)__s = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = __s;
    }
    else if (uVar5 < 0x11) {
      *(undefined8 *)__s = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = __s;
    }
    else if (uVar5 < 0x19) {
      *(undefined8 *)__s = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = __s;
    }
    else if (uVar5 < 0x21) {
      *(undefined8 *)__s = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = __s;
    }
    else if (uVar5 < 0x31) {
      *(undefined8 *)__s = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = __s;
    }
    else if (uVar5 < 0x41) {
      *(undefined8 *)__s = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = __s;
    }
    else {
      operator_delete(__s,0x10);
    }
  }
  return (bool)(bVar16 ^ (uVar12 & 4) == 0);
}

Assistant:

bool FiniteModelMultiSorted::evaluateGroundLiteral(Literal* lit)
{
  ASS(lit->ground());

#if DEBUG_MODEL
  cout << "Evaluating ground literal " << lit->toString() << endl;
#endif

  // evaluate all arguments
  unsigned arity = env.signature->predicateArity(lit->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(lit->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+lit->toString()+
                    " on "+(lit->nthArgument(i)->term()->toString())+
                    ", probably a partial model");
  }

  if(lit->isEquality()){
    bool res = args[0]==args[1];
#if DEBUG_MODEL
    cout << "Evaluate equality, args " << args[0] << " and " << args[1] << endl;
    cout << "res is " << (lit->polarity() ? res : !res) << endl;
#endif
    if(lit->polarity()) return res;
    else return !res;
  }

  OperatorType* sig = env.signature->getPredicate(lit->functor())->predType();
  unsigned var = _p_offsets[lit->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }

#if VDEBUG
  if((lit->functor()+1)<_p_offsets.size()) ASS_L(var,_p_offsets[lit->functor()+1]);
#endif
  ASS_L(var,_p_interpretation.size());

  char res = _p_interpretation[var];
#if DEBUG_MODEL
    cout << "res is " << res << " and polarity is " << lit->polarity() << endl;
#endif

  if(res==INTP_UNDEF)
    USER_ERROR("Could not evaluate "+lit->toString()+", probably a partial model");

  return (res==INTP_TRUE) == (lit->polarity());
}